

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint16 ma_dr_wav_fmt_get_format(ma_dr_wav_fmt *pFMT)

{
  ma_uint16 mVar1;
  
  if (pFMT != (ma_dr_wav_fmt *)0x0) {
    mVar1 = pFMT->formatTag;
    if (mVar1 == 0xfffe) {
      mVar1 = *(ma_uint16 *)pFMT->subFormat;
    }
    return mVar1;
  }
  return 0;
}

Assistant:

MA_API ma_uint16 ma_dr_wav_fmt_get_format(const ma_dr_wav_fmt* pFMT)
{
    if (pFMT == NULL) {
        return 0;
    }
    if (pFMT->formatTag != MA_DR_WAVE_FORMAT_EXTENSIBLE) {
        return pFMT->formatTag;
    } else {
        return ma_dr_wav_bytes_to_u16(pFMT->subFormat);
    }
}